

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O3

int fy_parse_peek_at(fy_parser *fyp,int pos)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  size_t offset;
  
  if (pos < 1) {
    offset = 0;
  }
  else {
    offset = 0;
    do {
      uVar1 = fy_parse_peek_at_offset(fyp,offset);
      if ((int)uVar1 < 0) {
        return uVar1;
      }
      lVar3 = 1;
      if ((0x7f < uVar1) && (lVar3 = 2, 0x7ff < uVar1)) {
        lVar3 = 4 - (ulong)(uVar1 < 0x10000);
      }
      offset = offset + lVar3;
      pos = pos + -1;
    } while (pos != 0);
  }
  iVar2 = fy_parse_peek_at_offset(fyp,offset);
  return iVar2;
}

Assistant:

static inline int fy_parse_peek_at(struct fy_parser *fyp, int pos) {
    return fy_parse_peek_at_internal(fyp, pos, NULL);
}